

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

void object_skeleton_set_property(GObject *gobject,guint prop_id,GValue *value,GParamSpec *pspec)

{
  gchar *pgVar1;
  int iVar2;
  GType GVar3;
  undefined8 uVar4;
  long *plVar5;
  undefined8 uVar6;
  GParamSpec *_glib__pspec;
  GTypeInstance *__inst;
  GObject *_glib__object;
  
  GVar3 = object_skeleton_get_type();
  uVar4 = g_type_check_instance_cast(gobject,GVar3);
  if (prop_id != 1) {
    pgVar1 = pspec->name;
    uVar4 = g_type_name(((pspec->g_type_instance).g_class)->g_type);
    uVar6 = g_type_name(((gobject->g_type_instance).g_class)->g_type);
    g_log(0,0x10,"%s:%d: invalid %s id %u for \"%s\" of type \'%s\' in \'%s\'",
          "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O1/basics_gen.c"
          ,0x6d0,"property",prop_id,pgVar1,uVar4,uVar6);
    return;
  }
  plVar5 = (long *)g_value_get_object(value);
  if (plVar5 != (long *)0x0) {
    GVar3 = greetable_get_type();
    if (((GType *)*plVar5 == (GType *)0x0) || (*(GType *)*plVar5 != GVar3)) {
      iVar2 = g_type_check_instance_is_a(plVar5,GVar3);
      if (iVar2 == 0) {
        object_skeleton_set_property_cold_1();
      }
    }
    uVar6 = g_dbus_object_skeleton_get_type();
    uVar4 = g_type_check_instance_cast(uVar4,uVar6);
    g_dbus_object_skeleton_add_interface(uVar4,plVar5);
    return;
  }
  uVar6 = g_dbus_object_skeleton_get_type();
  uVar4 = g_type_check_instance_cast(uVar4,uVar6);
  g_dbus_object_skeleton_remove_interface_by_name(uVar4,"io.mangoh.Testing.Greetable");
  return;
}

Assistant:

static void
object_skeleton_set_property (GObject      *gobject,
  guint         prop_id,
  const GValue *value,
  GParamSpec   *pspec)
{
  ObjectSkeleton *object = OBJECT_SKELETON (gobject);
  GDBusInterfaceSkeleton *interface;

  switch (prop_id)
    {
    case 1:
      interface = g_value_get_object (value);
      if (interface != NULL)
        {
          g_warn_if_fail (IS_GREETABLE (interface));
          g_dbus_object_skeleton_add_interface (G_DBUS_OBJECT_SKELETON (object), interface);
        }
      else
        {
          g_dbus_object_skeleton_remove_interface_by_name (G_DBUS_OBJECT_SKELETON (object), "io.mangoh.Testing.Greetable");
        }
      break;

    default:
      G_OBJECT_WARN_INVALID_PROPERTY_ID (gobject, prop_id, pspec);
      break;
  }
}